

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseLineCase::iterate(BaseLineCase *this)

{
  int iVar1;
  TestLog *pTVar2;
  PixelFormat *pPVar3;
  MessageBuilder *pMVar4;
  float extraout_XMM0_Da;
  MessageBuilder local_2e0;
  undefined1 local_160 [8];
  LineSceneSpec scene;
  RasterizationArguments args;
  bool compareOk;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> lines;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  float lineWidth;
  ScopedLogSection section;
  int local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string iterationDescription;
  BaseLineCase *this_local;
  
  local_9c = *(int *)&(this->super_BaseRenderingCase).field_0xc4 + 1;
  iterationDescription.field_2._8_8_ = this;
  de::toString<int>(&local_98,&local_9c);
  std::operator+(&local_78,"Test iteration ",&local_98);
  std::operator+(&local_58,&local_78," / ");
  de::toString<int>((string *)&section,&this->m_iterationCount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  pTVar2 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&stack0xffffffffffffff28,pTVar2,(string *)local_38,
             (string *)local_38);
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
            ();
  iVar1 = (this->super_BaseRenderingCase).m_renderSize;
  resultImage.m_pixels.m_cap._4_4_ = extraout_XMM0_Da;
  tcu::Surface::Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,iVar1,iVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &lines.
              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::vector
            ((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              *)&args.blueBits);
  if (this->m_maxLineWidth < resultImage.m_pixels.m_cap._4_4_) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx);
    tcu::TestLog::operator<<(&local_2e0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_2e0,(char (*) [12])"Line width ");
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(float *)((long)&resultImage.m_pixels.m_cap + 4));
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [36])" not supported, skipping iteration.");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2e0);
  }
  else {
    (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7]
    )(this,(ulong)*(uint *)&(this->super_BaseRenderingCase).field_0xc4,
      &lines.
       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage,&args.blueBits);
    BaseRenderingCase::drawPrimitives
              (&this->super_BaseRenderingCase,
               (Surface *)
               &drawBuffer.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &lines.
                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this->m_primitiveDrawType);
    tcu::LineSceneSpec::LineSceneSpec((LineSceneSpec *)local_160);
    scene.lineWidth = (float)(this->super_BaseRenderingCase).m_numSamples;
    scene._28_4_ = (this->super_BaseRenderingCase).m_subpixelBits;
    pPVar3 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
    args.numSamples = pPVar3->redBits;
    pPVar3 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
    args.subpixelBits = pPVar3->greenBits;
    pPVar3 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
    args.redBits = pPVar3->blueBits;
    std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::swap
              ((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                *)local_160,
               (vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                *)&args.blueBits);
    scene.lines.
    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = resultImage.m_pixels.m_cap._4_4_;
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx);
    args.greenBits._3_1_ =
         tcu::verifyLineGroupRasterization
                   ((Surface *)
                    &drawBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(LineSceneSpec *)local_160,
                    (RasterizationArguments *)&scene.lineWidth,pTVar2);
    if ((((scene.lines.
           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ != 1.0) ||
         (NAN(scene.lines.
              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_))) &&
        (1 < (this->super_BaseRenderingCase).m_numSamples)) && (!(bool)args.greenBits._3_1_)) {
      this->m_multisampleRelaxationRequired = true;
      args.greenBits._3_1_ = true;
    }
    if ((bool)args.greenBits._3_1_ == false) {
      this->m_allIterationsPassed = false;
    }
    tcu::LineSceneSpec::~LineSceneSpec((LineSceneSpec *)local_160);
  }
  iVar1 = *(int *)&(this->super_BaseRenderingCase).field_0xc4 + 1;
  *(int *)&(this->super_BaseRenderingCase).field_0xc4 = iVar1;
  if (iVar1 == this->m_iterationCount) {
    if (((this->m_allIterationsPassed & 1U) == 0) ||
       ((this->m_multisampleRelaxationRequired & 1U) == 0)) {
      if ((this->m_allIterationsPassed & 1U) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Incorrect rasterization");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_COMPATIBILITY_WARNING,
                 "Rasterization of multisampled wide lines failed");
    }
    this_local._4_4_ = STOP;
  }
  else {
    this_local._4_4_ = CONTINUE;
  }
  std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~vector((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> *)
          &args.blueBits);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &lines.
              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&stack0xffffffffffffff28);
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

BaseLineCase::IterateResult BaseLineCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// gen data
		generateLines(m_iteration, drawBuffer, lines);

		// draw image
		drawPrimitives(resultImage, drawBuffer, m_primitiveDrawType);

		// compare
		{
			bool					compareOk;
			RasterizationArguments	args;
			LineSceneSpec			scene;

			args.numSamples		= m_numSamples;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= getPixelFormat().redBits;
			args.greenBits		= getPixelFormat().greenBits;
			args.blueBits		= getPixelFormat().blueBits;

			scene.lines.swap(lines);
			scene.lineWidth = lineWidth;

			compareOk = verifyLineGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

			// multisampled wide lines might not be supported
			if (scene.lineWidth != 1.0f && m_numSamples > 1 && !compareOk)
			{
				m_multisampleRelaxationRequired = true;
				compareOk = true;
			}

			if (!compareOk)
				m_allIterationsPassed = false;
		}
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed && m_multisampleRelaxationRequired)
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Rasterization of multisampled wide lines failed");
		else if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}